

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutFlowBC.cpp
# Opt level: O0

void OutFlowBC::GetOutFlowFaces
               (bool *haveOutFlow,Orientation *outFaces,BCRec *_phys_bc,int *numOutFlowBC)

{
  int *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined1 *in_RDI;
  int idir;
  Orientation local_4c;
  Orientation local_48;
  int local_44;
  int *local_40;
  long local_38;
  long local_30;
  undefined1 *local_28;
  int local_1c;
  long local_18;
  int local_c;
  long local_8;
  
  *in_RDI = 0;
  *in_RCX = 0;
  local_40 = in_RCX;
  local_38 = in_RDX;
  local_30 = in_RSI;
  local_28 = in_RDI;
  for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
    local_18 = local_38;
    local_1c = local_44;
    if (*(int *)(local_38 + (long)local_44 * 4) == 2) {
      *local_28 = 1;
      amrex::Orientation::Orientation(&local_48,local_44,low);
      *(int *)(local_30 + (long)*local_40 * 4) = local_48.val;
      *local_40 = *local_40 + 1;
    }
    local_8 = local_38;
    local_c = local_44;
    if (*(int *)(local_38 + (long)(local_44 + 3) * 4) == 2) {
      *local_28 = 1;
      amrex::Orientation::Orientation(&local_4c,local_44,high);
      *(int *)(local_30 + (long)*local_40 * 4) = local_4c.val;
      *local_40 = *local_40 + 1;
    }
  }
  return;
}

Assistant:

void
OutFlowBC::GetOutFlowFaces (bool&        haveOutFlow,
                            Orientation* outFaces,
                            BCRec*       _phys_bc,
                            int&        numOutFlowBC)
{
    haveOutFlow = false;

    numOutFlowBC = 0;

    for (int idir = 0; idir < BL_SPACEDIM; idir++)
    {
        if (_phys_bc->lo(idir) == Outflow)
        {
            haveOutFlow = true;
            outFaces[numOutFlowBC] = Orientation(idir,Orientation::low);
            numOutFlowBC++;
        }

        if (_phys_bc->hi(idir) == Outflow)
        {
            haveOutFlow = true;
            outFaces[numOutFlowBC] = Orientation(idir,Orientation::high);
            numOutFlowBC++;
        }
    }
}